

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

void __thiscall Func::SetHasImplicitCallsOnSelfAndParents(Func *this)

{
  Func *pFVar1;
  
  this->field_0x241 = this->field_0x241 | 0x80;
  pFVar1 = this->parentFunc;
  while ((pFVar1 != (Func *)0x0 && (pFVar1->parentFunc != (Func *)0x0))) {
    pFVar1->field_0x241 = pFVar1->field_0x241 | 0x80;
    pFVar1 = pFVar1->parentFunc;
  }
  return;
}

Assistant:

void                SetHasImplicitCallsOnSelfAndParents()
                        {
                            this->SetHasImplicitCalls(true);
                            Func *curFunc = this->GetParentFunc();
                            while (curFunc && !curFunc->IsTopFunc())
                            {
                                curFunc->SetHasImplicitCalls(true);
                                curFunc = curFunc->GetParentFunc();
                            }
                        }